

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_tools.cxx
# Opt level: O0

void replace_all(string *str,string *from,string *to)

{
  ulong uVar1;
  string *psVar2;
  size_t start_pos;
  string *to_local;
  string *from_local;
  string *str_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    while (uVar1 = std::__cxx11::string::find((string *)str,(ulong)from),
          uVar1 != 0xffffffffffffffff) {
      psVar2 = (string *)std::__cxx11::string::length();
      std::__cxx11::string::replace((ulong)str,uVar1,psVar2);
      std::__cxx11::string::length();
    }
  }
  return;
}

Assistant:

void replace_all(std::string& str, const std::string& from, const std::string& to) {
	if (from.empty())
		return;
	size_t start_pos = 0;
	while ((start_pos = str.find(from, start_pos)) != std::string::npos) {
		str.replace(start_pos, from.length(), to);
		start_pos += to.length();
	}
}